

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4hc.c
# Opt level: O1

int LZ4_resetStreamStateHC(void *state,char *inputBuffer)

{
  int iVar1;
  LZ4_streamHC_t *LZ4_streamHCPtr;
  ulong uVar2;
  
  if (((ulong)state & 7) == 0 && state != (void *)0x0) {
    memset(state,0,0x40030);
    *(undefined2 *)((long)state + 0x40024) = 9;
  }
  else {
    state = (void *)0x0;
  }
  if (state == (void *)0x0) {
    iVar1 = 1;
  }
  else {
    uVar2 = *(long *)((long)state + 0x40000) - *(long *)((long)state + 0x40008);
    if (0x40000000 < uVar2) {
      uVar2 = 0;
      memset(state,0,0x20000);
      memset((void *)((long)state + 0x20000),0xff,0x20000);
    }
    iVar1 = (int)uVar2 + 0x10000;
    *(int *)((long)state + 0x40020) = iVar1;
    *(char **)((long)state + 0x40008) = inputBuffer + (-0x10000 - uVar2);
    *(char **)((long)state + 0x40000) = inputBuffer;
    *(char **)((long)state + 0x40010) = inputBuffer + (-0x10000 - uVar2);
    *(int *)((long)state + 0x40018) = iVar1;
    *(int *)((long)state + 0x4001c) = iVar1;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int LZ4_resetStreamStateHC(void* state, char* inputBuffer)
{
    LZ4_streamHC_t* const hc4 = LZ4_initStreamHC(state, sizeof(*hc4));
    if (hc4 == NULL) return 1;   /* init failed */
    LZ4HC_init_internal (&hc4->internal_donotuse, (const BYTE*)inputBuffer);
    return 0;
}